

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O1

SIBEdge * GetEdge(SIBMesh *mesh,uint32_t posA,uint32_t posB)

{
  pointer *ppSVar1;
  pointer pSVar2;
  pointer pSVar3;
  iterator __position;
  iterator iVar4;
  mapped_type *pmVar5;
  SIBEdge *pSVar6;
  SIBEdge edge;
  SIBPair pair;
  SIBEdge local_2c;
  key_type local_20;
  
  local_20.second = posA;
  if (posA < posB) {
    local_20.second = posB;
    posB = posA;
  }
  local_20.first = posB;
  iVar4 = std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
          ::find(&(mesh->edgeMap)._M_t,&local_20);
  if ((_Rb_tree_header *)iVar4._M_node == &(mesh->edgeMap)._M_t._M_impl.super__Rb_tree_header) {
    local_2c._8_4_ = local_2c._8_4_ & 0xffffff00;
    local_2c.faceA = 0xffffffff;
    local_2c.faceB = 0xffffffff;
    pSVar2 = (mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar3 = (mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
    pmVar5 = std::
             map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
             ::operator[](&mesh->edgeMap,&local_20);
    *pmVar5 = (int)((ulong)((long)pSVar2 - (long)pSVar3) >> 2) * -0x55555555;
    __position._M_current =
         (mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<SIBEdge,std::allocator<SIBEdge>>::_M_realloc_insert<SIBEdge_const&>
                ((vector<SIBEdge,std::allocator<SIBEdge>> *)&mesh->edges,__position,&local_2c);
    }
    else {
      (__position._M_current)->creased = local_2c.creased;
      *(undefined3 *)&(__position._M_current)->field_0x9 = local_2c._9_3_;
      (__position._M_current)->faceA = local_2c.faceA;
      (__position._M_current)->faceB = local_2c.faceB;
      ppSVar1 = &(mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    pSVar6 = (mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
  }
  else {
    pSVar6 = (mesh->edges).super__Vector_base<SIBEdge,_std::allocator<SIBEdge>_>._M_impl.
             super__Vector_impl_data._M_start + *(uint *)&iVar4._M_node[1]._M_parent;
  }
  return pSVar6;
}

Assistant:

static SIBEdge& GetEdge(SIBMesh* mesh, uint32_t posA, uint32_t posB) {
    SIBPair pair = (posA < posB) ? SIBPair(posA, posB) : SIBPair(posB, posA);
    std::map<SIBPair, uint32_t>::iterator it = mesh->edgeMap.find(pair);
    if (it != mesh->edgeMap.end())
        return mesh->edges[it->second];

    SIBEdge edge;
    edge.creased = false;
    edge.faceA = edge.faceB = 0xffffffff;
    mesh->edgeMap[pair] = static_cast<uint32_t>(mesh->edges.size());
    mesh->edges.push_back(edge);
    return mesh->edges.back();
}